

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int __thiscall icu_63::UnicodeString::copy(UnicodeString *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char16_t *dst_00;
  char16_t *extraout_RAX;
  int32_t in_ECX;
  int limit;
  int start;
  UChar *text;
  int32_t dest_local;
  int32_t limit_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  start = (int)dst;
  limit = (int)src;
  dst_00 = (char16_t *)((ulong)src & 0xffffffff);
  if ((start < limit) &&
     (dst_00 = (char16_t *)uprv_malloc_63((long)(limit - start) << 1), dst_00 != (char16_t *)0x0)) {
    extractBetween(this,start,limit,dst_00,0);
    insert(this,in_ECX,dst_00,0,limit - start);
    uprv_free_63(dst_00);
    dst_00 = extraout_RAX;
  }
  return (int)dst_00;
}

Assistant:

void 
UnicodeString::copy(int32_t start, int32_t limit, int32_t dest) {
    if (limit <= start) {
        return; // Nothing to do; avoid bogus malloc call
    }
    UChar* text = (UChar*) uprv_malloc( sizeof(UChar) * (limit - start) );
    // Check to make sure text is not null.
    if (text != NULL) {
	    extractBetween(start, limit, text, 0);
	    insert(dest, text, 0, limit - start);    
	    uprv_free(text);
    }
}